

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O1

TrieNode<unsigned_char> * pseudo_sample<unsigned_char>(uchar **strings,size_t n)

{
  byte bVar1;
  uchar *puVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  TrieNode<unsigned_char> *__s;
  void *__s_00;
  ulong uVar6;
  TrieNode<unsigned_char> *pTVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  
  __s = (TrieNode<unsigned_char> *)operator_new(0x820);
  memset(__s,0,0x820);
  if (n != 0) {
    lVar8 = 0x3857;
    uVar6 = 0;
    do {
      puVar2 = strings[uVar6];
      if (puVar2 == (uchar *)0x0) {
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x26,"unsigned char get_char(unsigned char *, size_t)");
      }
      lVar10 = 0;
      pTVar7 = __s;
      do {
        bVar1 = puVar2[lVar10];
        uVar9 = (ulong)bVar1;
        if (uVar9 == 0) {
          bVar4 = false;
          iVar5 = 6;
        }
        else {
          lVar10 = lVar10 + 1;
          uVar3 = (pTVar7->is_trie).super__Base_bitset<4UL>._M_w[bVar1 >> 6];
          if ((uVar3 >> (uVar9 & 0x3f) & 1) == 0) {
            (pTVar7->is_trie).super__Base_bitset<4UL>._M_w[bVar1 >> 6] =
                 uVar3 | 1L << (bVar1 & 0x3f);
            __s_00 = operator_new(0x820);
            bVar4 = false;
            memset(__s_00,0,0x820);
            (pTVar7->buckets)._M_elems[uVar9] = __s_00;
            lVar8 = lVar8 + -1;
            if (lVar8 == 0) {
              iVar5 = 7;
              lVar8 = 0;
              goto LAB_0019d7fb;
            }
          }
          pTVar7 = (TrieNode<unsigned_char> *)(pTVar7->buckets)._M_elems[uVar9];
          if (pTVar7 == (TrieNode<unsigned_char> *)0x0) {
            __assert_fail("node",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort.cpp"
                          ,0xcb,
                          "TrieNode<CharT> *pseudo_sample(unsigned char **, size_t) [CharT = unsigned char]"
                         );
          }
          iVar5 = 0;
          bVar4 = true;
        }
LAB_0019d7fb:
      } while (iVar5 == 0);
      if (iVar5 == 6) {
        bVar4 = true;
      }
    } while ((bVar4) && (uVar6 = uVar6 + 0x2000, uVar6 < n));
  }
  return __s;
}

Assistant:

static TrieNode<CharT>*
pseudo_sample(unsigned char** strings, size_t n)
{
	// Limit the maximum number of nodes to whatever fits in 30 megabytes.
	debug()<<__func__<<"(): sampling "<<n/8192<<" strings ...\n";
	size_t max_nodes = 30000000/sizeof(TrieNode<CharT>);
	TrieNode<CharT>* root = new TrieNode<CharT>;
	for (size_t i=0; i < n; i += 8192) {
		unsigned char* str = strings[i];
		size_t depth = 0;
		TrieNode<CharT>* node = root;
		while (true) {
			CharT c = get_char<CharT>(str, depth);
			if (is_end(c)) break;
			depth += sizeof(CharT);
			if (not node->is_trie[c]) {
				node->is_trie[c] = true;
				node->buckets[c] = new TrieNode<CharT>;
				if (--max_nodes==0) goto finish;
			}
			node = static_cast<TrieNode<CharT>*>(node->buckets[c]);
			assert(node);
		}
	}
finish:
	debug()<<"   Sampling done, created "
	       <<(30000000/sizeof(TrieNode<CharT>))-max_nodes<<" nodes.\n";
	return root;
}